

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

LazyObject * __thiscall Assimp::STEP::DB::GetObject(DB *this,string *type)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  reference ppLVar4;
  bool bVar5;
  _Rb_tree_const_iterator<const_Assimp::STEP::LazyObject_*> local_38;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  string *type_local;
  DB *this_local;
  
  it._M_node = (_Base_ptr)type;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
       ::find(&this->objects_bytype,type);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
       ::end(&this->objects_bytype);
  bVar1 = std::operator!=(&local_28,&local_30);
  bVar5 = false;
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
             ::operator*(&local_28);
    sVar2 = std::
            set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
            ::size(&ppVar3->second);
    bVar5 = sVar2 != 0;
  }
  if (bVar5) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
             ::operator*(&local_28);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
         ::begin(&ppVar3->second);
    ppLVar4 = std::_Rb_tree_const_iterator<const_Assimp::STEP::LazyObject_*>::operator*(&local_38);
    this_local = (DB *)*ppLVar4;
  }
  else {
    this_local = (DB *)0x0;
  }
  return (LazyObject *)this_local;
}

Assistant:

const LazyObject* GetObject(const std::string& type) const {
            const ObjectMapByType::const_iterator it = objects_bytype.find(type);
            if (it != objects_bytype.end() && (*it).second.size()) {
                return *(*it).second.begin();
            }
            return NULL;
        }